

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O2

void __thiscall trng::yarn4::split(yarn4 *this,uint s,uint n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong s_00;
  int iVar7;
  bool bVar8;
  int32_t b [16];
  int32_t a [4];
  
  s_00 = (ulong)s;
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)b,"invalid argument for trng::yarn4::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)b);
    std::invalid_argument::~invalid_argument((invalid_argument *)b);
  }
  if (1 < s) {
    jump(this,(ulong)n + 1);
    iVar7 = (this->S).r[0];
    jump(this,s_00);
    iVar1 = (this->S).r[0];
    jump(this,s_00);
    iVar2 = (this->S).r[0];
    jump(this,s_00);
    iVar3 = (this->S).r[0];
    jump(this,s_00);
    iVar4 = (this->S).r[0];
    jump(this,s_00);
    iVar5 = (this->S).r[0];
    jump(this,s_00);
    iVar6 = (this->S).r[0];
    jump(this,s_00);
    a[3] = (this->S).r[0];
    b[0] = iVar3;
    b[1] = iVar2;
    b[2] = iVar1;
    b[3] = iVar7;
    b[4] = iVar4;
    b[5] = iVar3;
    b[6] = iVar2;
    b[7] = iVar1;
    b[8] = iVar5;
    b[9] = iVar4;
    b[10] = iVar3;
    b[0xb] = iVar2;
    b[0xc] = iVar6;
    b[0xd] = iVar5;
    b[0xe] = iVar4;
    b[0xf] = iVar3;
    a[0] = iVar4;
    a[1] = iVar5;
    a[2] = iVar6;
    int_math::gauss<4>(&b,&a,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(a[1],a[0]);
    *(ulong *)((this->P).a + 2) = CONCAT44(a[3],a[2]);
    (this->S).r[0] = iVar3;
    (this->S).r[1] = iVar2;
    (this->S).r[2] = iVar1;
    (this->S).r[3] = iVar7;
    iVar7 = 4;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      backward(this);
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn4::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      int32_t a[4], b[16];
      a[0] = q4;
      b[0] = q3;
      b[1] = q2;
      b[2] = q1;
      b[3] = q0;
      a[1] = q5;
      b[4] = q4;
      b[5] = q3;
      b[6] = q2;
      b[7] = q1;
      a[2] = q6;
      b[8] = q5;
      b[9] = q4;
      b[10] = q3;
      b[11] = q2;
      a[3] = q7;
      b[12] = q6;
      b[13] = q5;
      b[14] = q4;
      b[15] = q3;
      int_math::gauss<4>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      S.r[0] = q3;
      S.r[1] = q2;
      S.r[2] = q1;
      S.r[3] = q0;
      for (int i{0}; i < 4; ++i)
        backward();
    }
  }